

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SHA256.cpp
# Opt level: O0

String * SHA256::hashFile(String *__return_storage_ptr__,Path *file,MapType type)

{
  bool bVar1;
  char *data;
  size_t sVar2;
  undefined1 local_58 [8];
  MemoryMappedFile mmf;
  MapType type_local;
  Path *file_local;
  
  mmf.mFileSize._4_4_ = type;
  MemoryMappedFile::MemoryMappedFile((MemoryMappedFile *)local_58,file,READ_ONLY,DONT_LOCK);
  bVar1 = MemoryMappedFile::isOpen((MemoryMappedFile *)local_58);
  if (bVar1) {
    data = (char *)MemoryMappedFile::filePtr<void>((MemoryMappedFile *)local_58);
    sVar2 = MemoryMappedFile::size((MemoryMappedFile *)local_58);
    hash(__return_storage_ptr__,data,(uint)sVar2,mmf.mFileSize._4_4_);
  }
  else {
    String::String(__return_storage_ptr__,(char *)0x0,0xffffffffffffffff);
  }
  MemoryMappedFile::~MemoryMappedFile((MemoryMappedFile *)local_58);
  return __return_storage_ptr__;
}

Assistant:

String SHA256::hashFile(const Path& file, MapType type)
{
    MemoryMappedFile mmf(file);
    if(!mmf.isOpen()) return String();
    return hash(static_cast<const char*>(mmf.filePtr()), mmf.size(), type);
}